

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddAbs.c
# Opt level: O0

DdNode * Cudd_addExistAbstract(DdManager *manager,DdNode *f,DdNode *cube)

{
  int iVar1;
  DdNode *res;
  DdNode *cube_local;
  DdNode *f_local;
  DdManager *manager_local;
  
  two = cuddUniqueConst(manager,2.0);
  if (two == (DdNode *)0x0) {
    manager_local = (DdManager *)0x0;
  }
  else {
    *(int *)(((ulong)two & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)two & 0xfffffffffffffffe) + 4) + 1;
    iVar1 = addCheckPositiveCube(manager,cube);
    if (iVar1 == 0) {
      fprintf((FILE *)manager->err,"Error: Can only abstract cubes");
      manager_local = (DdManager *)0x0;
    }
    else {
      do {
        manager->reordered = 0;
        manager_local = (DdManager *)cuddAddExistAbstractRecur(manager,f,cube);
      } while (manager->reordered == 1);
      if (manager_local == (DdManager *)0x0) {
        Cudd_RecursiveDeref(manager,two);
        manager_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)manager_local & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)manager_local & 0xfffffffffffffffe) + 4) + 1;
        Cudd_RecursiveDeref(manager,two);
        *(int *)(((ulong)manager_local & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)manager_local & 0xfffffffffffffffe) + 4) + -1;
      }
    }
  }
  return &manager_local->sentinel;
}

Assistant:

DdNode *
Cudd_addExistAbstract(
  DdManager * manager,
  DdNode * f,
  DdNode * cube)
{
    DdNode *res;

    two = cuddUniqueConst(manager,(CUDD_VALUE_TYPE) 2);
    if (two == NULL) return(NULL);
    cuddRef(two);

    if (addCheckPositiveCube(manager, cube) == 0) {
        (void) fprintf(manager->err,"Error: Can only abstract cubes");
        return(NULL);
    }

    do {
        manager->reordered = 0;
        res = cuddAddExistAbstractRecur(manager, f, cube);
    } while (manager->reordered == 1);

    if (res == NULL) {
        Cudd_RecursiveDeref(manager,two);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(manager,two);
    cuddDeref(res);

    return(res);

}